

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetV3fAttribute(ImfHeader *hdr,char *name,float x,float y,float z)

{
  undefined1 uVar1;
  iterator this;
  TypedAttribute<Imath_3_2::Vec3<float>_> *this_00;
  Vec3<float> *this_01;
  ImfHeader *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  char *in_stack_00000030;
  Header *in_stack_00000038;
  exception *e;
  V3f v;
  Attribute *in_stack_00000510;
  char *in_stack_00000518;
  Header *in_stack_00000520;
  Header *in_stack_ffffffffffffff28;
  TypedAttribute<Imath_3_2::Vec3<float>_> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff58;
  Vec3<float> local_30 [2];
  ImfHeader *local_10;
  
  local_10 = in_RDI;
  Imath_3_2::Vec3<float>::Vec3(local_30,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
  anon_unknown.dwarf_70604::header(local_10);
  Imf_3_4::Header::find(in_stack_00000038,in_stack_00000030);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff30,(Iterator *)in_stack_ffffffffffffff28);
  anon_unknown.dwarf_70604::header(local_10);
  this._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_ffffffffffffff28);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff30,(Iterator *)in_stack_ffffffffffffff28);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff30,
                              (ConstIterator *)in_stack_ffffffffffffff28);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(local_10);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::TypedAttribute
              (in_stack_ffffffffffffff30,(Vec3<float> *)in_stack_ffffffffffffff28);
    Imf_3_4::Header::insert(in_stack_00000520,in_stack_00000518,in_stack_00000510);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec3<float>_> *)0x19d25b);
  }
  else {
    anon_unknown.dwarf_70604::header(local_10);
    this_00 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                        ((Header *)this._M_node,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff58));
    this_01 = Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::value(this_00);
    Imath_3_2::Vec3<float>::operator=(this_01,local_30);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV3fAttribute (
    ImfHeader* hdr, const char name[], float x, float y, float z)
{
    try
    {
        V3f v (x, y, z);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}